

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

void __thiscall cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(cmStateSnapshot *this)

{
  PositionType *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  long *plVar6;
  string *psVar7;
  PointerType pSVar8;
  PointerType pcVar9;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string currentBinDir;
  string currentSrcDir;
  string local_90;
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  psVar7 = (string *)GetDefinition(this,&local_70);
  if (psVar7 == (string *)0x0) {
    psVar7 = &cmValue::Empty_abi_cxx11_;
  }
  local_50 = local_40;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_CURRENT_BINARY_DIR","")
  ;
  psVar7 = (string *)GetDefinition(this,&local_90);
  if (psVar7 == (string *)0x0) {
    psVar7 = &cmValue::Empty_abi_cxx11_;
  }
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  InitializeFromParent(this);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_SOURCE_DIR","");
  psVar7 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  sVar4 = psVar7->_M_string_length;
  this_00 = &this->Position;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value._M_str = pcVar3;
  value._M_len = sVar4;
  cmDefinitions::Set(pcVar9,&local_90,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_BINARY_DIR","");
  psVar7 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  sVar4 = psVar7->_M_string_length;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_00._M_str = pcVar3;
  value_00._M_len = sVar4;
  cmDefinitions::Set(pcVar9,&local_90,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  plVar6 = local_50;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_01._M_str = (char *)plVar6;
  value_01._M_len = local_48;
  cmDefinitions::Set(pcVar9,&local_90,value_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_CURRENT_BINARY_DIR","")
  ;
  _Var5._M_p = local_70._M_dataplus._M_p;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_02._M_str = _Var5._M_p;
  value_02._M_len = local_70._M_string_length;
  cmDefinitions::Set(pcVar9,&local_90,value_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void cmStateSnapshot::InitializeFromParent_ForSubdirsCommand()
{
  std::string currentSrcDir = *this->GetDefinition("CMAKE_CURRENT_SOURCE_DIR");
  std::string currentBinDir = *this->GetDefinition("CMAKE_CURRENT_BINARY_DIR");
  this->InitializeFromParent();
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());

  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR", currentSrcDir);
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR", currentBinDir);
}